

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O3

void Acec_VerifyClasses(Gia_Man_t *p,Vec_Wec_t *vLits,Vec_Wec_t *vReprs)

{
  ulong uVar1;
  Vec_Int_t *pVVar2;
  ulong uVar3;
  ulong uVar4;
  void *__ptr;
  uint *__ptr_00;
  void *pvVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Wrd_t *vTemp;
  word *pwVar8;
  Vec_Wrd_t *p_00;
  word wVar9;
  byte bVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  word Entry;
  int iVar19;
  word wVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  
  uVar11 = vLits->nSize;
  __ptr_00 = (uint *)malloc(0x10);
  uVar22 = 8;
  if (6 < uVar11 - 1) {
    uVar22 = (ulong)uVar11;
  }
  __ptr_00[1] = 0;
  uVar21 = (uint)uVar22;
  *__ptr_00 = uVar21;
  if (uVar21 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = malloc((long)(int)uVar21 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar5;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar6->pArray = piVar7;
  iVar25 = p->nObjs;
  vTemp = (Vec_Wrd_t *)malloc(0x10);
  iVar18 = 0x10;
  if (0xe < iVar25 - 1U) {
    iVar18 = iVar25;
  }
  vTemp->nCap = iVar18;
  uVar15 = 0;
  if (iVar18 == 0) {
    pwVar8 = (word *)0x0;
  }
  else {
    pwVar8 = (word *)malloc((long)iVar18 << 3);
  }
  vTemp->pArray = pwVar8;
  vTemp->nSize = iVar25;
  memset(pwVar8,0,(long)iVar25 << 3);
  if (0 < (int)uVar11) {
    iVar25 = 0;
    uVar16 = 0;
    do {
      pVVar2 = vLits->pArray;
      iVar18 = pVVar2[uVar16].nSize;
      p_00 = (Vec_Wrd_t *)malloc(0x10);
      iVar19 = iVar18;
      if (iVar18 - 1U < 0xf) {
        iVar19 = 0x10;
      }
      p_00->nSize = 0;
      p_00->nCap = iVar19;
      if (iVar19 == 0) {
        pwVar8 = (word *)0x0;
      }
      else {
        pwVar8 = (word *)malloc((long)iVar19 << 3);
      }
      p_00->pArray = pwVar8;
      if (0 < iVar18) {
        lVar17 = 0;
        do {
          wVar9 = Gia_ObjComputeTruth6Cis(p,pVVar2[uVar16].pArray[lVar17],pVVar6,vTemp);
          iVar18 = pVVar6->nSize;
          uVar11 = 1;
          Entry = 0x1234567812345678;
          if ((long)iVar18 < 7) {
            wVar20 = wVar9;
            if (iVar18 < 1) {
              iVar19 = 0;
            }
            else {
              piVar7 = pVVar6->pArray;
              lVar13 = 0;
              lVar14 = 0xa26a98;
              pwVar8 = s_Truths6Neg;
              iVar19 = 0;
              do {
                bVar10 = (byte)(1 << ((byte)lVar13 & 0x1f));
                if ((*pwVar8 & (wVar20 >> (bVar10 & 0x3f) ^ wVar20)) != 0) {
                  lVar12 = (long)iVar19;
                  if (lVar12 < lVar13) {
                    if (piVar7 != (int *)0x0) {
                      piVar7[lVar12] = piVar7[lVar13];
                    }
                    bVar10 = (char)(-1 << ((byte)iVar19 & 0x1f)) + bVar10;
                    lVar12 = lVar12 * 0x90;
                    wVar20 = (wVar20 & *(ulong *)(lVar14 + 8 + lVar12)) >> (bVar10 & 0x3f) |
                             (*(ulong *)(lVar14 + lVar12) & wVar20) << (bVar10 & 0x3f) |
                             *(ulong *)(lVar14 + -8 + lVar12) & wVar20;
                  }
                  iVar19 = iVar19 + 1;
                }
                lVar13 = lVar13 + 1;
                pwVar8 = pwVar8 + 1;
                lVar14 = lVar14 + 0x18;
              } while (iVar18 != lVar13);
            }
            Entry = wVar9;
            if ((iVar19 != iVar18) && (Entry = wVar20, iVar18 <= iVar19)) {
              __assert_fail("k < nVars",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                            ,0x754,"int Abc_Tt6MinBase(word *, int *, int)");
            }
            pVVar6->nSize = iVar19;
            uVar11 = (uint)(5 < iVar19);
            if (5 < iVar19) {
              Entry = 0x1234567812345678;
            }
          }
          iVar25 = iVar25 + uVar11;
          Vec_WrdPush(p_00,Entry);
          lVar17 = lVar17 + 1;
        } while (lVar17 < pVVar2[uVar16].nSize);
      }
      iVar18 = (int)uVar22;
      if ((int)uVar16 == iVar18) {
        if (iVar18 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar5 = malloc(0x80);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr_00 + 2),0x80);
          }
          *(void **)(__ptr_00 + 2) = pvVar5;
          *__ptr_00 = 0x10;
          uVar22 = 0x10;
        }
        else {
          uVar22 = (ulong)(uint)(iVar18 * 2);
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar5 = malloc(uVar22 * 8);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr_00 + 2),uVar22 * 8);
          }
          *(void **)(__ptr_00 + 2) = pvVar5;
          *__ptr_00 = iVar18 * 2;
        }
      }
      else {
        pvVar5 = *(void **)(__ptr_00 + 2);
      }
      uVar15 = uVar16 + 1;
      __ptr_00[1] = (uint)uVar15;
      *(Vec_Wrd_t **)((long)pvVar5 + (uVar16 & 0xffffffff) * 8) = p_00;
      uVar16 = uVar15;
    } while ((long)uVar15 < (long)vLits->nSize);
    if (iVar25 != 0) {
      printf("Detected %d oversize support nodes.\n");
    }
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
  }
  free(pVVar6);
  if (vTemp->pArray != (word *)0x0) {
    free(vTemp->pArray);
  }
  free(vTemp);
  iVar25 = vReprs->nSize;
  if (0 < iVar25) {
    uVar22 = 0;
    iVar18 = 0;
    do {
      if (uVar22 == (uVar15 & 0xffffffff)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pVVar6 = vReprs->pArray;
      iVar19 = pVVar6[uVar22].nSize;
      if (0 < iVar19) {
        lVar17 = *(long *)(*(long *)(__ptr_00 + 2) + uVar22 * 8);
        uVar23 = 1;
        uVar16 = 0;
        do {
          uVar1 = uVar16 + 1;
          lVar13 = (long)iVar19;
          if ((long)uVar1 < lVar13) {
            uVar11 = pVVar6[uVar22].pArray[uVar16];
            uVar24 = uVar23;
            do {
              lVar13 = (long)*(int *)(lVar17 + 4);
              if ((lVar13 <= (long)uVar16) || (lVar13 <= (long)uVar24)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                              ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
              }
              uVar21 = pVVar6[uVar22].pArray[uVar24];
              lVar13 = *(long *)(lVar17 + 8);
              uVar3 = *(ulong *)(lVar13 + uVar16 * 8);
              uVar4 = *(ulong *)(lVar13 + uVar24 * 8);
              if ((((uVar11 == uVar21) && (iVar18 = iVar18 + 1, uVar4 != 0x1234567812345678)) &&
                  (uVar3 != 0x1234567812345678)) && (uVar3 != uVar4)) {
                printf("Rank %d:  Lit %d and %d do not pass verification.\n",uVar22 & 0xffffffff,
                       uVar16 & 0xffffffff,uVar24 & 0xffffffff);
              }
              if ((int)uVar21 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x131,"int Abc_LitNot(int)");
              }
              if ((((uVar21 ^ uVar11) == 1) && (iVar18 = iVar18 + 1, uVar3 != 0x1234567812345678))
                 && (((uVar3 ^ uVar4) != 0xffffffffffffffff && (uVar4 != 0x1234567812345678)))) {
                printf("Rank %d:  Lit %d and %d do not pass verification.\n",uVar22 & 0xffffffff,
                       uVar16 & 0xffffffff,uVar24 & 0xffffffff);
              }
              uVar24 = uVar24 + 1;
              iVar19 = pVVar6[uVar22].nSize;
            } while ((int)uVar24 < iVar19);
            lVar13 = (long)iVar19;
          }
          uVar23 = uVar23 + 1;
          uVar16 = uVar1;
        } while ((long)uVar1 < lVar13);
        iVar25 = vReprs->nSize;
      }
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < (long)iVar25);
    if (iVar18 != 0) {
      printf("Total errors in equivalence classes = %d.\n");
    }
  }
  uVar11 = __ptr_00[1];
  pvVar5 = *(void **)(__ptr_00 + 2);
  if ((long)(int)uVar11 < 1) {
    if (pvVar5 == (void *)0x0) goto LAB_00669c7a;
  }
  else {
    lVar17 = 0;
    do {
      __ptr = *(void **)((long)pvVar5 + lVar17 * 8);
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
        }
        free(__ptr);
      }
      lVar17 = lVar17 + 1;
    } while ((int)uVar11 != lVar17);
  }
  free(pvVar5);
LAB_00669c7a:
  free(__ptr_00);
  return;
}

Assistant:

void Acec_VerifyClasses( Gia_Man_t * p, Vec_Wec_t * vLits, Vec_Wec_t * vReprs )
{
    Vec_Ptr_t * vFunc = Vec_PtrAlloc( Vec_WecSize(vLits) );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, j, k, Entry, Entry2, nOvers = 0, nErrors = 0;
    Vec_WecForEachLevel( vLits, vLevel, i )
    {
        Vec_Wrd_t * vTruths = Vec_WrdAlloc( Vec_IntSize(vLevel) );
        Vec_IntForEachEntry( vLevel, Entry, k )
        {
            word Truth = Gia_ObjComputeTruth6Cis( p, Entry, vSupp, vTemp );
            if ( Vec_IntSize(vSupp) > 6  )
            {
                nOvers++;
                Vec_WrdPush( vTruths, TRUTH_UNUSED );
                continue;
            }
            vSupp->nSize = Abc_Tt6MinBase( &Truth, vSupp->pArray, vSupp->nSize );
            if ( Vec_IntSize(vSupp) > 5  )
            {
                nOvers++;
                Vec_WrdPush( vTruths, TRUTH_UNUSED );
                continue;
            }
            Vec_WrdPush( vTruths, Truth );
        }
        Vec_PtrPush( vFunc, vTruths );
    }
    if ( nOvers )
        printf( "Detected %d oversize support nodes.\n", nOvers );
    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
    // verify the classes
    Vec_WecForEachLevel( vReprs, vLevel, i )
    {
        Vec_Wrd_t * vTruths = (Vec_Wrd_t *)Vec_PtrEntry( vFunc, i );
        Vec_IntForEachEntry( vLevel, Entry, k )
        Vec_IntForEachEntryStart( vLevel, Entry2, j, k+1 )
        {
            word Truth = Vec_WrdEntry( vTruths, k );
            word Truth2 = Vec_WrdEntry( vTruths, j );
            if ( Entry == Entry2 )
            {
                nErrors++;
                if ( Truth != Truth2 && Truth != TRUTH_UNUSED && Truth2 != TRUTH_UNUSED )
                    printf( "Rank %d:  Lit %d and %d do not pass verification.\n", i, k, j );
            }
            if ( Entry == Abc_LitNot(Entry2) )
            {
                nErrors++;
                if ( Truth != ~Truth2 && Truth != TRUTH_UNUSED && Truth2 != TRUTH_UNUSED )
                    printf( "Rank %d:  Lit %d and %d do not pass verification.\n", i, k, j );
            }
        }
    }
    if ( nErrors )
        printf( "Total errors in equivalence classes = %d.\n", nErrors );
    Vec_VecFree( (Vec_Vec_t *)vFunc );
}